

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_fmsub_df_mips64
               (CPUMIPSState_conflict5 *env,uint32_t df,uint32_t wd,uint32_t ws,uint32_t wt)

{
  int32_t *piVar1;
  float_status *pfVar2;
  byte bVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  float32 fVar9;
  fpr_t *pfVar10;
  float64 fVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  float64 *pfVar16;
  bool bVar17;
  float_status *status;
  uint uVar18;
  uint32_t unaff_retaddr;
  wr_t wx;
  float64 local_48;
  float64 afStack_40 [2];
  
  pfVar10 = (env->active_fpu).fpr + wd;
  lVar4 = (ulong)ws * 0x10 + 0x338;
  lVar5 = (ulong)wt * 0x10 + 0x338;
  piVar1 = &(env->active_tc).msacsr;
  *piVar1 = *piVar1 & 0xfffc0fff;
  if (df == 2) {
    pfVar2 = &(env->active_tc).msa_fp_status;
    lVar12 = 0;
    do {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar9 = float32_muladd_mips64
                        (*(float32 *)((long)(env->active_fpu).fpr + lVar12 * 4 + lVar4 + -0x338),
                         *(float32 *)((long)(env->active_fpu).fpr + lVar12 * 4 + lVar5 + -0x338),
                         pfVar10->fs[lVar12],2,pfVar2);
      *(float32 *)((long)afStack_40 + lVar12 * 4 + -8) = fVar9;
      if ((fVar9 & 0x7fffffff) == 0) {
        uVar18 = (uint)(env->active_tc).msa_fp_status.float_exception_flags;
      }
      else {
        bVar3 = (env->active_tc).msa_fp_status.float_exception_flags;
        uVar18 = (uint)bVar3;
        if ((fVar9 & 0x7f800000) == 0) {
          uVar18 = bVar3 | 0x10;
        }
      }
      uVar7 = ieee_ex_to_mips_mips64(uVar18);
      uVar13 = (env->active_tc).msacsr;
      uVar15 = (uVar13 & 0x1000000) >> 0x18 & uVar18 >> 6;
      uVar14 = 3;
      if ((uVar13 & 0x1000000) == 0) {
        uVar14 = uVar15;
      }
      if (uVar18 < 0x80) {
        uVar14 = uVar15;
      }
      uVar14 = uVar14 | uVar7;
      uVar15 = (uint)((uVar13 >> 9 & 1) == 0 & (byte)uVar7 >> 2);
      uVar8 = uVar15 | uVar14;
      uVar18 = uVar7 & 0xfffffffc;
      if ((uVar15 != 0 || (uVar14 & 1) != 0) || (uVar13 & 0x100) != 0) {
        uVar18 = uVar8;
      }
      if ((uVar14 & 2) == 0) {
        uVar18 = uVar8;
      }
      if ((uVar18 & (uVar13 >> 7 & 0x1f | 0x20)) == 0) {
        uVar14 = uVar18 << 0xc;
LAB_008bc2be:
        (env->active_tc).msacsr = uVar14 & 0x3f000 | uVar13;
        if (((uVar13 >> 7 & 0x1f | 0x20) & uVar18) != 0) goto LAB_008bc2d8;
      }
      else {
        if ((uVar13 >> 0x12 & 1) == 0) {
          uVar14 = uVar18 << 0xc | uVar13;
          uVar13 = uVar13 & 0xfff80fff;
          goto LAB_008bc2be;
        }
LAB_008bc2d8:
        fVar9 = float32_default_nan_mips64(pfVar2);
        *(float32 *)((long)afStack_40 + lVar12 * 4 + -8) = fVar9 & 0xffffffc0 ^ 0x400000 | uVar18;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
  }
  else {
    if (df != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                    ,0x1961,
                    "void helper_msa_fmsub_df_mips64(CPUMIPSState *, uint32_t, uint32_t, uint32_t, uint32_t)"
                   );
    }
    pfVar2 = &(env->active_tc).msa_fp_status;
    pfVar16 = &local_48;
    lVar12 = 0;
    bVar6 = true;
    do {
      bVar17 = bVar6;
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar11 = float64_muladd_mips64
                         (*(float64 *)((long)(env->active_fpu).fpr + lVar12 * 8 + lVar4 + -0x338),
                          *(float64 *)((long)(env->active_fpu).fpr + lVar12 * 8 + lVar5 + -0x338),
                          (&pfVar10->fd)[lVar12],2,pfVar2);
      *pfVar16 = fVar11;
      if ((fVar11 & 0x7fffffffffffffff) == 0) {
        uVar18 = (uint)(env->active_tc).msa_fp_status.float_exception_flags;
      }
      else {
        bVar3 = (env->active_tc).msa_fp_status.float_exception_flags;
        uVar18 = (uint)bVar3;
        if ((fVar11 & 0x7ff0000000000000) == 0) {
          uVar18 = bVar3 | 0x10;
        }
      }
      uVar7 = ieee_ex_to_mips_mips64(uVar18);
      uVar13 = (env->active_tc).msacsr;
      uVar15 = (uVar13 & 0x1000000) >> 0x18 & uVar18 >> 6;
      uVar14 = 3;
      if ((uVar13 & 0x1000000) == 0) {
        uVar14 = uVar15;
      }
      if (uVar18 < 0x80) {
        uVar14 = uVar15;
      }
      uVar14 = uVar14 | uVar7;
      uVar15 = (uint)((uVar13 >> 9 & 1) == 0 & (byte)uVar7 >> 2);
      uVar8 = uVar15 | uVar14;
      uVar18 = uVar7 & 0xfffffffc;
      if ((uVar15 != 0 || (uVar14 & 1) != 0) || (uVar13 & 0x100) != 0) {
        uVar18 = uVar8;
      }
      if ((uVar14 & 2) == 0) {
        uVar18 = uVar8;
      }
      if ((uVar18 & (uVar13 >> 7 & 0x1f | 0x20)) == 0) {
        uVar14 = uVar18 << 0xc;
LAB_008bc16c:
        (env->active_tc).msacsr = uVar14 & 0x3f000 | uVar13;
        if (((uVar13 >> 7 & 0x1f | 0x20) & uVar18) != 0) goto LAB_008bc186;
      }
      else {
        if ((uVar13 >> 0x12 & 1) == 0) {
          uVar14 = uVar18 << 0xc | uVar13;
          uVar13 = uVar13 & 0xfff80fff;
          goto LAB_008bc16c;
        }
LAB_008bc186:
        fVar11 = float64_default_nan_mips64(pfVar2);
        *pfVar16 = (long)(int)uVar18 | fVar11 & 0xffffffffffffffc0 ^ 0x8000000000000;
      }
      lVar12 = 1;
      pfVar16 = afStack_40;
      bVar6 = false;
    } while (bVar17);
  }
  uVar18 = (env->active_tc).msacsr;
  uVar13 = uVar18 >> 7 & 0x1f | 0x20;
  if ((uVar13 & uVar18 >> 0xc) != 0) {
    do_raise_exception(env,unaff_retaddr,(ulong)uVar13);
  }
  (env->active_tc).msacsr = (uVar18 >> 0xc & 0x1f) << 2 | uVar18;
  pfVar10->fd = local_48;
  *(float64 *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = afStack_40[0];
  return;
}

Assistant:

void helper_msa_fmsub_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
        uint32_t ws, uint32_t wt)
{
    wr_t wx, *pwx = &wx;
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);
    uint32_t i;

    clear_msacsr_cause(env);

    switch (df) {
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            MSA_FLOAT_MULADD(pwx->w[i], pwd->w[i],
                           pws->w[i], pwt->w[i],
                           float_muladd_negate_product, 32);
      }
      break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            MSA_FLOAT_MULADD(pwx->d[i], pwd->d[i],
                           pws->d[i], pwt->d[i],
                           float_muladd_negate_product, 64);
        }
        break;
    default:
        assert(0);
    }

    check_msacsr_cause(env, GETPC());

    msa_move_v(pwd, pwx);
}